

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,string *obj,cmFortranSourceInfo *info,string *mod_dir,
          string *stamp_dir,ostream *makeDepends,ostream *internalDepends,bool buildingIntrinsics)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  cmGlobalGenerator *pcVar5;
  cmGlobalUnixMakefileGenerator3 *this_00;
  iterator __first;
  iterator __last;
  ulong uVar6;
  pointer ppVar7;
  reference __x;
  pointer pcVar8;
  cmMakefile *this_01;
  string *psVar9;
  cmOutputConverter *this_02;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  string_view sVar11;
  string local_518;
  string local_4f8;
  cmAlphaNum local_4d8;
  cmAlphaNum local_4a8;
  undefined1 local_478 [8];
  string driver;
  allocator<char> local_449;
  string local_448;
  cmValue local_428;
  cmValue cid;
  cmMakefile *mf;
  string stampFileForMake;
  undefined1 local_3e8 [8];
  string stampFileForShell;
  cmAlphaNum local_3a8;
  cmAlphaNum local_378;
  undefined1 local_348 [8];
  string stampFile_1;
  string local_2f8;
  cmAlphaNum local_2d8;
  cmAlphaNum local_2a8;
  undefined1 local_278 [8];
  string modFile;
  string *i_2;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_208;
  undefined1 local_1e8 [8];
  string module;
  undefined1 local_1a8 [8];
  string stampFile;
  _Self local_180;
  iterator required;
  _Self local_170;
  reference local_168;
  string *i_1;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_138 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  req;
  undefined1 local_e8 [8];
  string dependee;
  string *i;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool supportLongLineDepend;
  string *lineContinue;
  undefined1 local_88 [8];
  string obj_m;
  string obj_i;
  string *src;
  bool buildingIntrinsics_local;
  ostream *makeDepends_local;
  string *stamp_dir_local;
  string *mod_dir_local;
  cmFortranSourceInfo *info_local;
  string *obj_local;
  cmDependsFortran *this_local;
  
  psVar9 = (string *)((long)&obj_m.field_2 + 8);
  cmOutputConverter::MaybeRelativeToTopBinDir
            (psVar9,&(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                     super_cmLocalGenerator.super_cmOutputConverter,obj);
  cmSystemTools::ConvertToOutputPath((string *)local_88,psVar9);
  poVar4 = std::operator<<(internalDepends,(string *)(obj_m.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"\n ");
  poVar4 = std::operator<<(poVar4,(string *)info);
  std::operator<<(poVar4,'\n');
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&info->Includes);
  if (!bVar2) {
    pcVar5 = cmLocalGenerator::GetGlobalGenerator
                       ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
    this_00 = (cmGlobalUnixMakefileGenerator3 *)
              cmLocalGenerator::GetGlobalGenerator
                        ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
    bVar2 = cmGlobalUnixMakefileGenerator3::SupportsLongLineDependencies(this_00);
    if (bVar2) {
      poVar4 = std::operator<<(makeDepends,(string *)local_88);
      std::operator<<(poVar4,':');
    }
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&info->Includes);
    i = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&info->Includes);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&i), bVar3) {
      dependee.field_2._8_8_ =
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end2);
      cmOutputConverter::MaybeRelativeToTopBinDir
                ((string *)&req._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                  super_cmLocalGenerator.super_cmOutputConverter,(string *)dependee.field_2._8_8_);
      cmSystemTools::ConvertToOutputPath
                ((string *)local_e8,(string *)&req._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::__cxx11::string::~string((string *)&req._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      if (bVar2) {
        poVar4 = std::operator<<(makeDepends,' ');
        poVar4 = std::operator<<(poVar4,(string *)pcVar5[1].MakeSilentFlag.field_2._M_local_buf);
        poVar4 = std::operator<<(poVar4,' ');
        std::operator<<(poVar4,(string *)local_e8);
      }
      else {
        poVar4 = std::operator<<(makeDepends,(string *)local_88);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)local_e8);
        std::operator<<(poVar4,'\n');
      }
      poVar4 = std::operator<<(internalDepends,' ');
      poVar4 = std::operator<<(poVar4,(string *)dependee.field_2._8_8_);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)local_e8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(makeDepends,'\n');
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_138,&info->Requires);
  if (buildingIntrinsics) {
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&info->Intrinsics);
    __last = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&info->Intrinsics);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_138,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last._M_node);
  }
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138);
  i_1 = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&i_1);
    if (!bVar2) {
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&info->Provides);
      if (!bVar2) {
        __end2_1 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&info->Provides);
        i_2 = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&info->Provides);
        while (bVar2 = std::operator!=(&__end2_1,(_Self *)&i_2), bVar2) {
          __x = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2_1);
          pcVar8 = std::
                   unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                   ::operator->(&this->Internal);
          pVar10 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&pcVar8->TargetProvides,__x);
          modFile.field_2._8_8_ = pVar10.first._M_node;
          cmAlphaNum::cmAlphaNum(&local_2a8,mod_dir);
          cmAlphaNum::cmAlphaNum(&local_2d8,'/');
          cmStrCat<std::__cxx11::string>((string *)local_278,&local_2a8,&local_2d8,__x);
          this_02 = &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                     super_cmLocalGenerator.super_cmOutputConverter;
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)((long)&stampFile_1.field_2 + 8),this_02,(string *)local_278);
          sVar11 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(stampFile_1.field_2._M_local_buf + 8));
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_2f8,this_02,sVar11,SHELL);
          std::__cxx11::string::operator=((string *)local_278,(string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)(stampFile_1.field_2._M_local_buf + 8));
          cmAlphaNum::cmAlphaNum(&local_378,stamp_dir);
          cmAlphaNum::cmAlphaNum(&local_3a8,'/');
          cmStrCat<std::__cxx11::string,char[7]>
                    ((string *)local_348,&local_378,&local_3a8,__x,(char (*) [7])".stamp");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)((long)&stampFileForShell.field_2 + 8),
                     &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                      super_cmLocalGenerator.super_cmOutputConverter,(string *)local_348);
          std::__cxx11::string::operator=
                    ((string *)local_348,(string *)(stampFileForShell.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(stampFileForShell.field_2._M_local_buf + 8));
          pcVar1 = (this->super_cmDepends).LocalGenerator;
          sVar11 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_348);
          stampFileForMake.field_2._8_8_ = sVar11._M_len;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    ((string *)local_3e8,
                     &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,sVar11,SHELL);
          cmSystemTools::ConvertToOutputPath((string *)&mf,(string *)local_348);
          poVar4 = std::operator<<(makeDepends,(string *)local_88);
          poVar4 = std::operator<<(poVar4,".provides.build");
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)&mf);
          std::operator<<(poVar4,'\n');
          poVar4 = std::operator<<(makeDepends,(string *)&mf);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)local_88);
          std::operator<<(poVar4,'\n');
          poVar4 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ");
          poVar4 = std::operator<<(poVar4,(string *)local_278);
          poVar4 = std::operator<<(poVar4,' ');
          std::operator<<(poVar4,(string *)local_3e8);
          this_01 = cmLocalGenerator::GetMakefile
                              ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
          cid.Value = (string *)this_01;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_448,"CMAKE_Fortran_COMPILER_ID",&local_449);
          local_428 = cmMakefile::GetDefinition(this_01,&local_448);
          std::__cxx11::string::~string((string *)&local_448);
          std::allocator<char>::~allocator(&local_449);
          driver.field_2._8_8_ = local_428.Value;
          bVar2 = cmNonempty(local_428);
          if (bVar2) {
            poVar4 = std::operator<<(makeDepends,' ');
            psVar9 = cmValue::operator*[abi_cxx11_(&local_428);
            std::operator<<(poVar4,(string *)psVar9);
          }
          std::operator<<(makeDepends,'\n');
          std::__cxx11::string::~string((string *)&mf);
          std::__cxx11::string::~string((string *)local_3e8);
          std::__cxx11::string::~string((string *)local_348);
          std::__cxx11::string::~string((string *)local_278);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2_1);
        }
        poVar4 = std::operator<<(makeDepends,(string *)local_88);
        std::operator<<(poVar4,".provides.build:\n");
        poVar4 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E touch ");
        poVar4 = std::operator<<(poVar4,(string *)local_88);
        std::operator<<(poVar4,".provides.build\n");
        cmAlphaNum::cmAlphaNum(&local_4a8,&(this->super_cmDepends).TargetDirectory);
        cmAlphaNum::cmAlphaNum(&local_4d8,"/build");
        cmStrCat<>((string *)local_478,&local_4a8,&local_4d8);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&local_518,
                   &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.super_cmOutputConverter,(string *)local_478);
        cmSystemTools::ConvertToOutputPath(&local_4f8,&local_518);
        std::__cxx11::string::operator=((string *)local_478,(string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_518);
        poVar4 = std::operator<<(makeDepends,(string *)local_478);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)local_88);
        std::operator<<(poVar4,".provides.build\n");
        std::__cxx11::string::~string((string *)local_478);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(obj_m.field_2._M_local_buf + 8));
      return true;
    }
    local_168 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end1);
    local_170._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&info->Provides,local_168);
    required._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::cend(&info->Provides);
    bVar2 = std::operator!=(&local_170,(_Self *)&required);
    if (!bVar2) {
      pcVar8 = std::
               unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
               ::operator->(&this->Internal);
      local_180._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&pcVar8->TargetRequires,local_168);
      pcVar8 = std::
               unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
               ::operator->(&this->Internal);
      stampFile.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&pcVar8->TargetRequires);
      bVar2 = std::operator==(&local_180,(_Self *)((long)&stampFile.field_2 + 8));
      if (bVar2) {
        abort();
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_180);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pcVar1 = (this->super_cmDepends).LocalGenerator;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_180);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  ((string *)((long)&module.field_2 + 8),
                   &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&ppVar7->second);
        cmSystemTools::ConvertToOutputPath
                  ((string *)local_1a8,(string *)((long)&module.field_2 + 8));
        std::__cxx11::string::~string((string *)(module.field_2._M_local_buf + 8));
        poVar4 = std::operator<<(makeDepends,(string *)local_88);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)local_1a8);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string((string *)local_1a8);
      }
      else {
        std::__cxx11::string::string((string *)local_1e8);
        bVar2 = FindModule(this,local_168,(string *)local_1e8);
        if (bVar2) {
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)&__range2_1,
                     &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                      super_cmLocalGenerator.super_cmOutputConverter,(string *)local_1e8);
          cmSystemTools::ConvertToOutputPath(&local_208,(string *)&__range2_1);
          std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&__range2_1);
          poVar4 = std::operator<<(makeDepends,(string *)local_88);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)local_1e8);
          std::operator<<(poVar4,'\n');
        }
        std::__cxx11::string::~string((string *)local_1e8);
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(std::string const& obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             std::string const& stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends,
                                             bool buildingIntrinsics)
{
  // Get the source file for this object.
  std::string const& src = info.Source;

  // Write the include dependencies to the output stream.
  std::string obj_i = this->LocalGenerator->MaybeRelativeToTopBinDir(obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << "\n " << src << '\n';
  if (!info.Includes.empty()) {
    const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->LineContinueDirective;
    bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                   this->LocalGenerator->GetGlobalGenerator())
                                   ->SupportsLongLineDependencies();
    if (supportLongLineDepend) {
      makeDepends << obj_m << ':';
    }
    for (std::string const& i : info.Includes) {
      std::string dependee = cmSystemTools::ConvertToOutputPath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(i));
      if (supportLongLineDepend) {
        makeDepends << ' ' << lineContinue << ' ' << dependee;
      } else {
        makeDepends << obj_m << ": " << dependee << '\n';
      }
      internalDepends << ' ' << i << '\n';
    }
    makeDepends << '\n';
  }

  std::set<std::string> req = info.Requires;
  if (buildingIntrinsics) {
    req.insert(info.Intrinsics.begin(), info.Intrinsics.end());
  }

  // Write module requirements to the output stream.
  for (std::string const& i : req) {
    // Require only modules not provided in the same source.
    if (info.Provides.find(i) != info.Provides.cend()) {
      continue;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    auto required = this->Internal->TargetRequires.find(i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(required->second));
      makeDepends << obj_m << ": " << stampFile << '\n';
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->LocalGenerator->MaybeRelativeToTopBinDir(module));
        makeDepends << obj_m << ": " << module << '\n';
      }
    }
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    for (std::string const& i : info.Provides) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string modFile = cmStrCat(mod_dir, '/', i);
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToTopBinDir(modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = cmStrCat(stamp_dir, '/', i, ".stamp");
      stampFile = this->LocalGenerator->MaybeRelativeToTopBinDir(stampFile);
      std::string const stampFileForShell =
        this->LocalGenerator->ConvertToOutputFormat(stampFile,
                                                    cmOutputConverter::SHELL);
      std::string const stampFileForMake =
        cmSystemTools::ConvertToOutputPath(stampFile);

      makeDepends << obj_m << ".provides.build"
                  << ": " << stampFileForMake << '\n';
      // Note that when cmake_copy_f90_mod finds that a module file
      // and the corresponding stamp file have no differences, the stamp
      // file is not updated. In such case the stamp file will be always
      // older than its prerequisite and trigger cmake_copy_f90_mod
      // on each new build. This is expected behavior for incremental
      // builds and can not be changed without preforming recursive make
      // calls that would considerably slow down the building process.
      makeDepends << stampFileForMake << ": " << obj_m << '\n';
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << ' ' << stampFileForShell;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      cmValue cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cmNonempty(cid)) {
        makeDepends << ' ' << *cid;
      }
      makeDepends << '\n';
    }
    makeDepends << obj_m << ".provides.build:\n";
    // After copying the modules update the timestamp file.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = cmStrCat(this->TargetDirectory, "/build");
    driver = cmSystemTools::ConvertToOutputPath(
      this->LocalGenerator->MaybeRelativeToTopBinDir(driver));
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}